

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

void stbi__out_gif_code(stbi__gif *g,stbi__uint16 code)

{
  bool bVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  int idx;
  stbi_uc *c;
  stbi_uc *p;
  stbi__uint16 code_local;
  stbi__gif *g_local;
  
  if (-1 < g->codes[code].prefix) {
    stbi__out_gif_code(g,g->codes[code].prefix);
  }
  if (g->cur_y < g->max_y) {
    iVar2 = g->cur_x + g->cur_y;
    psVar3 = g->out + iVar2;
    g->history[iVar2 / 4] = '\x01';
    psVar4 = g->color_table + (int)((uint)g->codes[code].suffix << 2);
    if (0x80 < psVar4[3]) {
      *psVar3 = psVar4[2];
      psVar3[1] = psVar4[1];
      psVar3[2] = *psVar4;
      psVar3[3] = psVar4[3];
    }
    g->cur_x = g->cur_x + 4;
    if (g->max_x <= g->cur_x) {
      g->cur_x = g->start_x;
      g->cur_y = g->step + g->cur_y;
      while( true ) {
        bVar1 = false;
        if (g->max_y <= g->cur_y) {
          bVar1 = 0 < g->parse;
        }
        if (!bVar1) break;
        g->step = (1 << ((byte)g->parse & 0x1f)) * g->line_size;
        g->cur_y = g->start_y + (g->step >> 1);
        g->parse = g->parse + -1;
      }
    }
  }
  return;
}

Assistant:

static void stbi__out_gif_code(stbi__gif *g, stbi__uint16 code)
{
   stbi_uc *p, *c;
   int idx;

   // recurse to decode the prefixes, since the linked-list is backwards,
   // and working backwards through an interleaved image would be nasty
   if (g->codes[code].prefix >= 0)
      stbi__out_gif_code(g, g->codes[code].prefix);

   if (g->cur_y >= g->max_y) return;

   idx = g->cur_x + g->cur_y;
   p = &g->out[idx];
   g->history[idx / 4] = 1;

   c = &g->color_table[g->codes[code].suffix * 4];
   if (c[3] > 128) { // don't render transparent pixels;
      p[0] = c[2];
      p[1] = c[1];
      p[2] = c[0];
      p[3] = c[3];
   }
   g->cur_x += 4;

   if (g->cur_x >= g->max_x) {
      g->cur_x = g->start_x;
      g->cur_y += g->step;

      while (g->cur_y >= g->max_y && g->parse > 0) {
         g->step = (1 << g->parse) * g->line_size;
         g->cur_y = g->start_y + (g->step >> 1);
         --g->parse;
      }
   }
}